

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::fix_up_interface_member_indices
          (CompilerMSL *this,StorageClass storage,uint32_t ib_type_id)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  ExecutionModel EVar4;
  uint32_t id;
  uint32_t index;
  mapped_type *pmVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  uint32_t index_00;
  key_type local_34;
  
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  if ((EVar4 != ExecutionModelTessellationControl) &&
     (EVar4 = Compiler::get_execution_model((Compiler *)this),
     storage != StorageClassInput || EVar4 != ExecutionModelTessellationEvaluation)) {
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if (storage != StorageClassInput) {
      return;
    }
    if (EVar4 != ExecutionModelFragment) {
      return;
    }
    if ((this->pull_model_inputs)._M_h._M_element_count == 0) {
      return;
    }
  }
  local_34.id = ib_type_id;
  pmVar5 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_34);
  uVar1 = (uint32_t)(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
  if (uVar1 != 0) {
    index_00 = 0;
    do {
      id = Compiler::get_extended_member_decoration
                     ((Compiler *)this,ib_type_id,index_00,SPIRVCrossDecorationInterfaceOrigID);
      if (id != 0) {
        var = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + id);
        pSVar6 = Compiler::get_variable_element_type((Compiler *)this,var);
        bVar2 = variable_storage_requires_stage_io(this,var->storage);
        bVar3 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
        if (((bVar3 || bVar2) && (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xf)) &&
           (index = Compiler::get_extended_member_decoration
                              ((Compiler *)this,ib_type_id,index_00,
                               SPIRVCrossDecorationInterfaceMemberIndex), index != 0xffffffff)) {
          bVar2 = Compiler::has_extended_member_decoration
                            ((Compiler *)this,id,index,SPIRVCrossDecorationInterfaceMemberIndex);
          if (!bVar2) {
            Compiler::set_extended_member_decoration
                      ((Compiler *)this,id,index,SPIRVCrossDecorationInterfaceMemberIndex,index_00);
          }
        }
        else {
          bVar2 = Compiler::has_extended_decoration
                            ((Compiler *)this,id,SPIRVCrossDecorationInterfaceMemberIndex);
          if (!bVar2) {
            Compiler::set_extended_decoration
                      ((Compiler *)this,id,SPIRVCrossDecorationInterfaceMemberIndex,index_00);
          }
        }
      }
      index_00 = index_00 + 1;
    } while (uVar1 != index_00);
  }
  return;
}

Assistant:

void CompilerMSL::fix_up_interface_member_indices(StorageClass storage, uint32_t ib_type_id)
{
	// Only needed for tessellation shaders and pull-model interpolants.
	// Need to redirect interface indices back to variables themselves.
	// For structs, each member of the struct need a separate instance.
	if (!is_tesc_shader() && !(is_tese_shader() && storage == StorageClassInput) &&
	    !(get_execution_model() == ExecutionModelFragment && storage == StorageClassInput &&
	      !pull_model_inputs.empty()))
		return;

	auto mbr_cnt = uint32_t(ir.meta[ib_type_id].members.size());
	for (uint32_t i = 0; i < mbr_cnt; i++)
	{
		uint32_t var_id = get_extended_member_decoration(ib_type_id, i, SPIRVCrossDecorationInterfaceOrigID);
		if (!var_id)
			continue;
		auto &var = get<SPIRVariable>(var_id);

		auto &type = get_variable_element_type(var);

		bool flatten_composites = variable_storage_requires_stage_io(var.storage);
		bool is_block = has_decoration(type.self, DecorationBlock);

		uint32_t mbr_idx = uint32_t(-1);
		if (type.basetype == SPIRType::Struct && (flatten_composites || is_block))
			mbr_idx = get_extended_member_decoration(ib_type_id, i, SPIRVCrossDecorationInterfaceMemberIndex);

		if (mbr_idx != uint32_t(-1))
		{
			// Only set the lowest InterfaceMemberIndex for each variable member.
			// IB struct members will be emitted in-order w.r.t. interface member index.
			if (!has_extended_member_decoration(var_id, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex))
				set_extended_member_decoration(var_id, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, i);
		}
		else
		{
			// Only set the lowest InterfaceMemberIndex for each variable.
			// IB struct members will be emitted in-order w.r.t. interface member index.
			if (!has_extended_decoration(var_id, SPIRVCrossDecorationInterfaceMemberIndex))
				set_extended_decoration(var_id, SPIRVCrossDecorationInterfaceMemberIndex, i);
		}
	}
}